

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5TextFromStmt(Fts5Config *pConfig,sqlite3_stmt *pStmt,int iCol,char **ppText,int *pnText)

{
  int iVar1;
  sqlite3_value *pVal;
  char *pcVar2;
  int i;
  long in_FS_OFFSET;
  int nLoc;
  char *pLoc;
  int local_44;
  uchar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  i = iCol + 1;
  pVal = sqlite3_column_value(pStmt,i);
  local_40 = (uchar *)0x0;
  local_44 = 0;
  if ((pConfig->bLocale != 0) && (pConfig->eContent == 2)) {
    iVar1 = sqlite3Fts5IsLocaleValue(pConfig,pVal);
    if (iVar1 != 0) {
      iVar1 = sqlite3Fts5DecodeLocaleValue(pVal,ppText,pnText,(char **)&local_40,&local_44);
      goto LAB_001ed0dc;
    }
  }
  pcVar2 = (char *)sqlite3ValueText(pVal,'\x01');
  *ppText = pcVar2;
  iVar1 = sqlite3ValueBytes(pVal,'\x01');
  *pnText = iVar1;
  iVar1 = 0;
  if ((pConfig->bLocale != 0) && (pConfig->eContent == 0)) {
    local_40 = sqlite3_column_text(pStmt,pConfig->nCol + i);
    local_44 = sqlite3_column_bytes(pStmt,i + pConfig->nCol);
  }
LAB_001ed0dc:
  (pConfig->t).pLocale = (char *)local_40;
  (pConfig->t).nLocale = local_44;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5TextFromStmt(
  Fts5Config *pConfig,
  sqlite3_stmt *pStmt,
  int iCol,
  const char **ppText,
  int *pnText
){
  sqlite3_value *pVal = sqlite3_column_value(pStmt, iCol+1);
  const char *pLoc = 0;
  int nLoc = 0;
  int rc = SQLITE_OK;

  if( pConfig->bLocale
   && pConfig->eContent==FTS5_CONTENT_EXTERNAL
   && sqlite3Fts5IsLocaleValue(pConfig, pVal)
  ){
    rc = sqlite3Fts5DecodeLocaleValue(pVal, ppText, pnText, &pLoc, &nLoc);
  }else{
    *ppText = (const char*)sqlite3_value_text(pVal);
    *pnText = sqlite3_value_bytes(pVal);
    if( pConfig->bLocale && pConfig->eContent==FTS5_CONTENT_NORMAL ){
      pLoc = (const char*)sqlite3_column_text(pStmt, iCol+1+pConfig->nCol);
      nLoc = sqlite3_column_bytes(pStmt, iCol+1+pConfig->nCol);
    }
  }
  sqlite3Fts5SetLocale(pConfig, pLoc, nLoc);
  return rc;
}